

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O0

void PredictLineLeft_SSE2(uint8_t *src,uint8_t *dst,int length)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int local_c0;
  __m128i C1;
  __m128i C0;
  __m128i B1;
  __m128i A1;
  __m128i B0;
  __m128i A0;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  int max_pos;
  int i;
  int length_local;
  uint8_t *dst_local;
  uint8_t *src_local;
  
  for (local_c0 = 0; local_c0 < (int)(length & 0xffffffe0U); local_c0 = local_c0 + 0x20) {
    uVar1 = *(undefined8 *)(src + local_c0);
    uVar2 = *(undefined8 *)(src + local_c0 + 8);
    uVar3 = *(undefined8 *)(src + (long)local_c0 + -1);
    uVar4 = *(undefined8 *)(src + (long)local_c0 + 7);
    uVar5 = *(undefined8 *)(src + (long)local_c0 + 0x10);
    uVar6 = *(undefined8 *)(src + (long)local_c0 + 0x18);
    uVar7 = *(undefined8 *)(src + (long)local_c0 + 0xf);
    uVar8 = *(undefined8 *)(src + (long)local_c0 + 0x17);
    i._0_1_ = (char)uVar1;
    i._1_1_ = (char)((ulong)uVar1 >> 8);
    i._2_1_ = (char)((ulong)uVar1 >> 0x10);
    i._3_1_ = (char)((ulong)uVar1 >> 0x18);
    length_local._0_1_ = (char)((ulong)uVar1 >> 0x20);
    length_local._1_1_ = (char)((ulong)uVar1 >> 0x28);
    length_local._2_1_ = (char)((ulong)uVar1 >> 0x30);
    length_local._3_1_ = (char)((ulong)uVar1 >> 0x38);
    dst_local._0_1_ = (char)uVar2;
    dst_local._1_1_ = (char)((ulong)uVar2 >> 8);
    dst_local._2_1_ = (char)((ulong)uVar2 >> 0x10);
    dst_local._3_1_ = (char)((ulong)uVar2 >> 0x18);
    dst_local._4_1_ = (char)((ulong)uVar2 >> 0x20);
    dst_local._5_1_ = (char)((ulong)uVar2 >> 0x28);
    dst_local._6_1_ = (char)((ulong)uVar2 >> 0x30);
    dst_local._7_1_ = (char)((ulong)uVar2 >> 0x38);
    A0[1]._0_1_ = (char)uVar3;
    A0[1]._1_1_ = (char)((ulong)uVar3 >> 8);
    A0[1]._2_1_ = (char)((ulong)uVar3 >> 0x10);
    A0[1]._3_1_ = (char)((ulong)uVar3 >> 0x18);
    A0[1]._4_1_ = (char)((ulong)uVar3 >> 0x20);
    A0[1]._5_1_ = (char)((ulong)uVar3 >> 0x28);
    A0[1]._6_1_ = (char)((ulong)uVar3 >> 0x30);
    A0[1]._7_1_ = (char)((ulong)uVar3 >> 0x38);
    cStack_20 = (char)uVar4;
    cStack_1f = (char)((ulong)uVar4 >> 8);
    cStack_1e = (char)((ulong)uVar4 >> 0x10);
    cStack_1d = (char)((ulong)uVar4 >> 0x18);
    max_pos._0_1_ = (char)((ulong)uVar4 >> 0x20);
    max_pos._1_1_ = (char)((ulong)uVar4 >> 0x28);
    max_pos._2_1_ = (char)((ulong)uVar4 >> 0x30);
    max_pos._3_1_ = (char)((ulong)uVar4 >> 0x38);
    B0[1]._0_1_ = (char)uVar5;
    B0[1]._1_1_ = (char)((ulong)uVar5 >> 8);
    B0[1]._2_1_ = (char)((ulong)uVar5 >> 0x10);
    B0[1]._3_1_ = (char)((ulong)uVar5 >> 0x18);
    B0[1]._4_1_ = (char)((ulong)uVar5 >> 0x20);
    B0[1]._5_1_ = (char)((ulong)uVar5 >> 0x28);
    B0[1]._6_1_ = (char)((ulong)uVar5 >> 0x30);
    B0[1]._7_1_ = (char)((ulong)uVar5 >> 0x38);
    A0[0]._0_1_ = (char)uVar6;
    A0[0]._1_1_ = (char)((ulong)uVar6 >> 8);
    A0[0]._2_1_ = (char)((ulong)uVar6 >> 0x10);
    A0[0]._3_1_ = (char)((ulong)uVar6 >> 0x18);
    A0[0]._4_1_ = (char)((ulong)uVar6 >> 0x20);
    A0[0]._5_1_ = (char)((ulong)uVar6 >> 0x28);
    A0[0]._6_1_ = (char)((ulong)uVar6 >> 0x30);
    A0[0]._7_1_ = (char)((ulong)uVar6 >> 0x38);
    A1[1]._0_1_ = (char)uVar7;
    A1[1]._1_1_ = (char)((ulong)uVar7 >> 8);
    A1[1]._2_1_ = (char)((ulong)uVar7 >> 0x10);
    A1[1]._3_1_ = (char)((ulong)uVar7 >> 0x18);
    A1[1]._4_1_ = (char)((ulong)uVar7 >> 0x20);
    A1[1]._5_1_ = (char)((ulong)uVar7 >> 0x28);
    A1[1]._6_1_ = (char)((ulong)uVar7 >> 0x30);
    A1[1]._7_1_ = (char)((ulong)uVar7 >> 0x38);
    B0[0]._0_1_ = (char)uVar8;
    B0[0]._1_1_ = (char)((ulong)uVar8 >> 8);
    B0[0]._2_1_ = (char)((ulong)uVar8 >> 0x10);
    B0[0]._3_1_ = (char)((ulong)uVar8 >> 0x18);
    B0[0]._4_1_ = (char)((ulong)uVar8 >> 0x20);
    B0[0]._5_1_ = (char)((ulong)uVar8 >> 0x28);
    B0[0]._6_1_ = (char)((ulong)uVar8 >> 0x30);
    B0[0]._7_1_ = (char)((ulong)uVar8 >> 0x38);
    *(ulong *)(dst + local_c0) =
         CONCAT17(length_local._3_1_ - A0[1]._7_1_,
                  CONCAT16(length_local._2_1_ - A0[1]._6_1_,
                           CONCAT15(length_local._1_1_ - A0[1]._5_1_,
                                    CONCAT14((char)length_local - A0[1]._4_1_,
                                             CONCAT13(i._3_1_ - A0[1]._3_1_,
                                                      CONCAT12(i._2_1_ - A0[1]._2_1_,
                                                               CONCAT11(i._1_1_ - A0[1]._1_1_,
                                                                        (char)i - (char)A0[1])))))))
    ;
    *(ulong *)(dst + local_c0 + 8) =
         CONCAT17(dst_local._7_1_ - max_pos._3_1_,
                  CONCAT16(dst_local._6_1_ - max_pos._2_1_,
                           CONCAT15(dst_local._5_1_ - max_pos._1_1_,
                                    CONCAT14(dst_local._4_1_ - (char)max_pos,
                                             CONCAT13(dst_local._3_1_ - cStack_1d,
                                                      CONCAT12(dst_local._2_1_ - cStack_1e,
                                                               CONCAT11(dst_local._1_1_ - cStack_1f,
                                                                        (char)dst_local - cStack_20)
                                                              ))))));
    *(ulong *)(dst + (long)local_c0 + 0x10) =
         CONCAT17(B0[1]._7_1_ - A1[1]._7_1_,
                  CONCAT16(B0[1]._6_1_ - A1[1]._6_1_,
                           CONCAT15(B0[1]._5_1_ - A1[1]._5_1_,
                                    CONCAT14(B0[1]._4_1_ - A1[1]._4_1_,
                                             CONCAT13(B0[1]._3_1_ - A1[1]._3_1_,
                                                      CONCAT12(B0[1]._2_1_ - A1[1]._2_1_,
                                                               CONCAT11(B0[1]._1_1_ - A1[1]._1_1_,
                                                                        (char)B0[1] - (char)A1[1])))
                                            ))));
    *(ulong *)(dst + (long)local_c0 + 0x18) =
         CONCAT17(A0[0]._7_1_ - B0[0]._7_1_,
                  CONCAT16(A0[0]._6_1_ - B0[0]._6_1_,
                           CONCAT15(A0[0]._5_1_ - B0[0]._5_1_,
                                    CONCAT14(A0[0]._4_1_ - B0[0]._4_1_,
                                             CONCAT13(A0[0]._3_1_ - B0[0]._3_1_,
                                                      CONCAT12(A0[0]._2_1_ - B0[0]._2_1_,
                                                               CONCAT11(A0[0]._1_1_ - B0[0]._1_1_,
                                                                        (char)A0[0] - (char)B0[0])))
                                            ))));
  }
  for (; local_c0 < length; local_c0 = local_c0 + 1) {
    dst[local_c0] = src[local_c0] - src[local_c0 + -1];
  }
  return;
}

Assistant:

static void PredictLineLeft_SSE2(const uint8_t* src, uint8_t* dst, int length) {
  int i;
  const int max_pos = length & ~31;
  assert(length >= 0);
  for (i = 0; i < max_pos; i += 32) {
    const __m128i A0 = _mm_loadu_si128((const __m128i*)(src + i +  0    ));
    const __m128i B0 = _mm_loadu_si128((const __m128i*)(src + i +  0 - 1));
    const __m128i A1 = _mm_loadu_si128((const __m128i*)(src + i + 16    ));
    const __m128i B1 = _mm_loadu_si128((const __m128i*)(src + i + 16 - 1));
    const __m128i C0 = _mm_sub_epi8(A0, B0);
    const __m128i C1 = _mm_sub_epi8(A1, B1);
    _mm_storeu_si128((__m128i*)(dst + i +  0), C0);
    _mm_storeu_si128((__m128i*)(dst + i + 16), C1);
  }
  for (; i < length; ++i) dst[i] = src[i] - src[i - 1];
}